

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O3

void __thiscall
flatbuffers::ts::TsGenerator::GenEnum
          (TsGenerator *this,EnumDef *enum_def,string *code_ptr,import_set *imports,bool reverse)

{
  _Base_ptr *pp_Var1;
  _Rb_tree_header *p_Var2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  BaseType BVar5;
  EnumVal *pEVar6;
  EnumDef *pEVar7;
  TsGenerator *this_00;
  long *plVar8;
  pointer ppEVar9;
  _Base_ptr p_Var10;
  undefined8 *puVar11;
  ulong *puVar12;
  long *plVar13;
  size_type *psVar14;
  pointer ppEVar15;
  string *psVar16;
  undefined8 uVar17;
  _Alloc_hider _Var18;
  ulong uVar19;
  string enum_type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> valid_union_type_with_null;
  size_type __dnew;
  string valid_union_type;
  anon_class_40_5_fa253b3e union_enum_loop;
  string local_338;
  EnumDef *local_318;
  string *local_310;
  string local_308;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e8;
  ulong *local_2b8;
  long local_2b0;
  ulong local_2a8;
  long lStack_2a0;
  string local_298;
  ulong *local_278;
  long local_270;
  ulong local_268;
  undefined4 uStack_260;
  undefined4 uStack_25c;
  long *local_258;
  long local_250;
  long local_248;
  long lStack_240;
  long *local_238;
  undefined8 local_230;
  long local_228;
  undefined8 uStack_220;
  TsGenerator *local_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_210;
  long local_200;
  long lStack_1f8;
  long *local_1f0;
  long local_1e8;
  long local_1e0;
  long lStack_1d8;
  long *local_1d0;
  long local_1c8;
  long local_1c0;
  long lStack_1b8;
  long *local_1b0;
  long local_1a8;
  long local_1a0;
  long lStack_198;
  undefined1 *local_190;
  long local_188;
  undefined1 local_180;
  undefined7 uStack_17f;
  import_set *local_170;
  IdlNamer *local_168;
  undefined1 local_160 [64];
  _Alloc_hider local_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  _Alloc_hider local_100;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f0;
  _Alloc_hider local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0 [2];
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  if (reverse || (enum_def->super_Definition).generated != false) {
    return;
  }
  local_170 = imports;
  GenDocComment(&(enum_def->super_Definition).doc_comment,code_ptr,(char *)0x0);
  std::__cxx11::string::append((char *)code_ptr);
  local_168 = &this->namer_;
  (*(this->namer_).super_Namer._vptr_Namer[0xf])(local_160,local_168,enum_def);
  std::__cxx11::string::_M_append((char *)code_ptr,local_160._0_8_);
  local_218 = this;
  if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
    operator_delete((void *)local_160._0_8_,(ulong)(local_160._16_8_ + 1));
  }
  local_310 = code_ptr;
  std::__cxx11::string::append((char *)code_ptr);
  ppEVar15 = (enum_def->vals).vec.
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  if (ppEVar15 !=
      (enum_def->vals).vec.
      super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pp_Var1 = &local_2e8._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      psVar16 = local_310;
      pEVar6 = *ppEVar15;
      if ((pEVar6->doc_comment).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (pEVar6->doc_comment).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        if (ppEVar15 !=
            (enum_def->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_start) {
          std::__cxx11::string::push_back((char)local_310);
        }
        GenDocComment(&pEVar6->doc_comment,psVar16,"  ");
      }
      (*(local_168->super_Namer)._vptr_Namer[0x13])(&local_2e8,local_168,pEVar6);
      plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_2e8,0,(char *)0x0,0x36edba);
      puVar12 = (ulong *)(plVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar8 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar12) {
        local_160._16_8_ = *puVar12;
        local_160._24_8_ = plVar8[3];
        local_160._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_160 + 0x10);
      }
      else {
        local_160._16_8_ = *puVar12;
        local_160._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar8;
      }
      local_160._8_8_ = plVar8[1];
      *plVar8 = (long)puVar12;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::__cxx11::string::_M_append((char *)local_310,local_160._0_8_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_160._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)(local_160 + 0x10)) {
        operator_delete((void *)local_160._0_8_,(ulong)(local_160._16_8_ + 1));
      }
      if ((_Base_ptr *)local_2e8._M_impl._0_8_ != pp_Var1) {
        operator_delete((void *)local_2e8._M_impl._0_8_,
                        (ulong)((long)&(local_2e8._M_impl.super__Rb_tree_header._M_header._M_parent)
                                       ->_M_color + 1));
      }
      psVar16 = local_310;
      std::__cxx11::string::append((char *)local_310);
      if ((enum_def->underlying_type).base_type - BASE_TYPE_LONG < 2) {
        EnumDef::ToString_abi_cxx11_(&local_338,enum_def,pEVar6);
        plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_338,0,(char *)0x0,0x389970);
        plVar13 = plVar8 + 2;
        if ((_Base_ptr *)*plVar8 == (_Base_ptr *)plVar13) {
          local_2e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar13;
          local_2e8._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar8[3];
          local_2e8._M_impl._0_8_ = pp_Var1;
        }
        else {
          local_2e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar13;
          local_2e8._M_impl._0_8_ = (_Base_ptr *)*plVar8;
        }
        local_2e8._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar8[1];
        *plVar8 = (long)plVar13;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        plVar8 = (long *)std::__cxx11::string::append((char *)&local_2e8);
        puVar12 = (ulong *)(plVar8 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar8 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar12) {
          local_160._16_8_ = *puVar12;
          local_160._24_8_ = plVar8[3];
          local_160._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_160 + 0x10);
        }
        else {
          local_160._16_8_ = *puVar12;
          local_160._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar8;
        }
        local_160._8_8_ = plVar8[1];
        *plVar8 = (long)puVar12;
        plVar8[1] = 0;
        *(undefined1 *)(plVar8 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_310,local_160._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._0_8_ !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)(local_160 + 0x10)) {
          operator_delete((void *)local_160._0_8_,(ulong)(local_160._16_8_ + 1));
        }
        if ((_Base_ptr *)local_2e8._M_impl._0_8_ != pp_Var1) {
          operator_delete((void *)local_2e8._M_impl._0_8_,
                          (ulong)((long)&(local_2e8._M_impl.super__Rb_tree_header._M_header.
                                         _M_parent)->_M_color + 1));
        }
        uVar17 = local_338.field_2._M_allocated_capacity;
        _Var18._M_p = local_338._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != &local_338.field_2) {
LAB_002398fa:
          operator_delete(_Var18._M_p,
                          (ulong)((long)&(((EnumDef *)uVar17)->super_Definition).name._M_dataplus.
                                         _M_p + 1));
        }
      }
      else {
        EnumDef::ToString_abi_cxx11_((string *)local_160,enum_def,pEVar6);
        std::__cxx11::string::_M_append((char *)psVar16,local_160._0_8_);
        uVar17 = local_160._16_8_;
        _Var18._M_p = (pointer)local_160._0_8_;
        if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) goto LAB_002398fa;
      }
      ppEVar15 = ppEVar15 + 1;
      std::__cxx11::string::append((char *)local_310);
    } while (ppEVar15 !=
             (enum_def->vals).vec.
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_finish);
  }
  psVar16 = local_310;
  std::__cxx11::string::append((char *)local_310);
  if (enum_def->is_union == false) goto LAB_0023ab57;
  local_318 = (enum_def->underlying_type).enum_def;
  if (local_318 == (EnumDef *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_ts.cpp"
                  ,0x416,
                  "std::string flatbuffers::ts::TsGenerator::GenUnionConvFunc(const Type &, import_set &)"
                 );
  }
  local_190 = &local_180;
  local_188 = 0;
  local_180 = 0;
  p_Var2 = &local_2e8._M_impl.super__Rb_tree_header;
  local_2e8._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_2e8._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_2e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppEVar15 = (local_318->vals).vec.
             super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
             _M_impl.super__Vector_impl_data._M_start;
  ppEVar9 = (local_318->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  local_2e8._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  if (ppEVar15 != ppEVar9) {
    paVar3 = &local_338.field_2;
    do {
      pEVar6 = *ppEVar15;
      if (pEVar6->value != 0) {
        local_338._M_string_length = 0;
        local_338.field_2._M_allocated_capacity =
             local_338.field_2._M_allocated_capacity & 0xffffffffffffff00;
        BVar5 = (pEVar6->union_type).base_type;
        local_338._M_dataplus._M_p = (pointer)paVar3;
        if (BVar5 == BASE_TYPE_STRUCT) {
          AddImport<flatbuffers::StructDef>
                    ((ImportDefinition *)local_160,local_218,local_170,&local_318->super_Definition,
                     (pEVar6->union_type).struct_def);
          std::__cxx11::string::operator=((string *)&local_338,(string *)local_160);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_p != local_b0) {
            operator_delete(local_c0._M_p,local_b0[0]._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_p != &local_d0) {
            operator_delete(local_e0._M_p,local_d0._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_100._M_p != &local_f0) {
            operator_delete(local_100._M_p,local_f0._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._M_p != &local_110) {
            operator_delete(local_120._M_p,local_110._M_allocated_capacity + 1);
          }
          if ((import_set *)local_160._32_8_ != (import_set *)(local_160 + 0x30)) {
            operator_delete((void *)local_160._32_8_,local_160._48_8_ + 1);
          }
          if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
            operator_delete((void *)local_160._0_8_,(ulong)(local_160._16_8_ + 1));
          }
        }
        else {
          if (BVar5 != BASE_TYPE_STRING) {
            __assert_fail("false",
                          "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_ts.cpp"
                          ,0x328,
                          "std::string flatbuffers::ts::TsGenerator::GenUnionTypeTS(const EnumDef &, import_set &)"
                         );
          }
          std::__cxx11::string::_M_replace((ulong)&local_338,0,(char *)0x0,0x37faf4);
        }
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_2e8,&local_338);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_338._M_dataplus._M_p != paVar3) {
          operator_delete(local_338._M_dataplus._M_p,
                          (ulong)(local_338.field_2._M_allocated_capacity + 1));
        }
        ppEVar9 = (local_318->vals).vec.
                  super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      ppEVar15 = ppEVar15 + 1;
    } while (ppEVar15 != ppEVar9);
    if ((_Rb_tree_header *)local_2e8._M_impl.super__Rb_tree_header._M_header._M_left != p_Var2) {
      p_Var10 = local_2e8._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        std::_Rb_tree_increment(p_Var10);
        local_160._0_8_ = local_160 + 0x10;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_160,*(long *)(p_Var10 + 1),
                   (long)&(p_Var10[1]._M_parent)->_M_color + *(long *)(p_Var10 + 1));
        std::__cxx11::string::append((char *)local_160);
        std::__cxx11::string::_M_append((char *)&local_190,local_160._0_8_);
        if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
          operator_delete((void *)local_160._0_8_,(ulong)(local_160._16_8_ + 1));
        }
        p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10);
      } while ((_Rb_tree_header *)p_Var10 != p_Var2);
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_2e8);
  local_2e8._M_impl._0_8_ = &local_2e8._M_impl.super__Rb_tree_header._M_header._M_parent;
  std::__cxx11::string::_M_construct<char*>((string *)&local_2e8,local_190,local_190 + local_188);
  std::__cxx11::string::append((char *)&local_2e8);
  pEVar7 = local_318;
  GenUnionConvFuncName_abi_cxx11_(&local_298,local_218,local_318);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_298,0,(char *)0x0,0x36e2cc);
  psVar16 = local_310;
  local_258 = &local_248;
  plVar13 = plVar8 + 2;
  if ((long *)*plVar8 == plVar13) {
    local_248 = *plVar13;
    lStack_240 = plVar8[3];
  }
  else {
    local_248 = *plVar13;
    local_258 = (long *)*plVar8;
  }
  local_250 = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_258);
  puVar12 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar12) {
    local_2a8 = *puVar12;
    lStack_2a0 = plVar8[3];
    local_2b8 = &local_2a8;
  }
  else {
    local_2a8 = *puVar12;
    local_2b8 = (ulong *)*plVar8;
  }
  local_2b0 = plVar8[1];
  *plVar8 = (long)puVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  (*(local_168->super_Namer)._vptr_Namer[0xf])(&local_278,local_168,pEVar7);
  uVar19 = 0xf;
  if (local_2b8 != &local_2a8) {
    uVar19 = local_2a8;
  }
  if (uVar19 < (ulong)(local_270 + local_2b0)) {
    uVar19 = 0xf;
    if (local_278 != &local_268) {
      uVar19 = local_268;
    }
    if (uVar19 < (ulong)(local_270 + local_2b0)) goto LAB_00239dc5;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,(ulong)local_2b8);
  }
  else {
LAB_00239dc5:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2b8,(ulong)local_278);
  }
  local_238 = &local_228;
  plVar8 = puVar11 + 2;
  if ((long *)*puVar11 == plVar8) {
    local_228 = *plVar8;
    uStack_220 = puVar11[3];
  }
  else {
    local_228 = *plVar8;
    local_238 = (long *)*puVar11;
  }
  local_230 = puVar11[1];
  *puVar11 = plVar8;
  puVar11[1] = 0;
  *(undefined1 *)plVar8 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_238);
  plVar13 = plVar8 + 2;
  if ((long *)*plVar8 == plVar13) {
    local_1e0 = *plVar13;
    lStack_1d8 = plVar8[3];
    local_1f0 = &local_1e0;
  }
  else {
    local_1e0 = *plVar13;
    local_1f0 = (long *)*plVar8;
  }
  local_1e8 = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_190);
  plVar13 = plVar8 + 2;
  if ((long *)*plVar8 == plVar13) {
    local_1c0 = *plVar13;
    lStack_1b8 = plVar8[3];
    local_1d0 = &local_1c0;
  }
  else {
    local_1c0 = *plVar13;
    local_1d0 = (long *)*plVar8;
  }
  local_1c8 = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  plVar13 = plVar8 + 2;
  if ((long *)*plVar8 == plVar13) {
    local_1a0 = *plVar13;
    lStack_198 = plVar8[3];
    local_1b0 = &local_1a0;
  }
  else {
    local_1a0 = *plVar13;
    local_1b0 = (long *)*plVar8;
  }
  local_1a8 = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_1b0,local_2e8._M_impl._0_8_);
  paVar3 = &local_308.field_2;
  psVar14 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_308.field_2._M_allocated_capacity = *psVar14;
    local_308.field_2._8_8_ = plVar8[3];
    local_308._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_308.field_2._M_allocated_capacity = *psVar14;
    local_308._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_308._M_string_length = plVar8[1];
  *plVar8 = (long)psVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_308);
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  psVar14 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_338.field_2._M_allocated_capacity = *psVar14;
    local_338.field_2._8_8_ = plVar8[3];
  }
  else {
    local_338.field_2._M_allocated_capacity = *psVar14;
    local_338._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_338._M_string_length = plVar8[1];
  *plVar8 = (long)psVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_338,local_2e8._M_impl._0_8_);
  local_160._0_8_ = local_160 + 0x10;
  plVar13 = plVar8 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar13) {
    local_160._16_8_ = *plVar13;
    local_160._24_8_ = plVar8[3];
  }
  else {
    local_160._16_8_ = *plVar13;
    local_160._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*plVar8;
  }
  local_160._8_8_ = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append(local_160);
  local_210._M_allocated_capacity = (size_type)&local_200;
  plVar13 = plVar8 + 2;
  if ((long *)*plVar8 == plVar13) {
    local_200 = *plVar13;
    lStack_1f8 = plVar8[3];
  }
  else {
    local_200 = *plVar13;
    local_210._M_allocated_capacity = (size_type)(long *)*plVar8;
  }
  local_210._8_8_ = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
    operator_delete((void *)local_160._0_8_,(ulong)(local_160._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != paVar3) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238,local_228 + 1);
  }
  if (local_278 != &local_268) {
    operator_delete(local_278,local_268 + 1);
  }
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8,local_2a8 + 1);
  }
  if (local_258 != &local_248) {
    operator_delete(local_258,local_248 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  AddImport<flatbuffers::EnumDef>
            ((ImportDefinition *)local_160,local_218,local_170,&local_318->super_Definition,
             local_318);
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  pcVar4 = local_160 + 0x10;
  if ((pointer)local_160._0_8_ == pcVar4) {
    local_338.field_2._8_8_ = local_160._24_8_;
  }
  else {
    local_338._M_dataplus._M_p = (pointer)local_160._0_8_;
  }
  local_338.field_2._M_allocated_capacity = local_160._16_8_;
  local_338._M_string_length = local_160._8_8_;
  local_160._8_8_ = (string *)0x0;
  local_160._16_8_ = local_160._16_8_ & 0xffffffffffffff00;
  local_160._0_8_ = pcVar4;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_p != local_b0) {
    operator_delete(local_c0._M_p,local_b0[0]._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_p != &local_d0) {
    operator_delete(local_e0._M_p,local_d0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_p != &local_f0) {
    operator_delete(local_100._M_p,local_f0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_p != &local_110) {
    operator_delete(local_120._M_p,local_110._M_allocated_capacity + 1);
  }
  if ((import_set *)local_160._32_8_ != (import_set *)(local_160 + 0x30)) {
    operator_delete((void *)local_160._32_8_,local_160._48_8_ + 1);
  }
  if ((undefined1 *)local_160._0_8_ != local_160 + 0x10) {
    operator_delete((void *)local_160._0_8_,local_160._16_8_ + 1);
  }
  this_00 = local_218;
  local_160._0_8_ = &local_210;
  local_160._16_8_ = local_318;
  local_160._24_8_ = local_218;
  local_160._32_8_ = local_170;
  local_308.field_2._M_allocated_capacity = 0x726f737365636361;
  local_308.field_2._8_2_ = 0x28;
  local_308._M_string_length = 9;
  local_308._M_dataplus._M_p = (pointer)paVar3;
  local_160._8_8_ = &local_338;
  GenUnionConvFunc::anon_class_40_5_fa253b3e::operator()
            ((anon_class_40_5_fa253b3e *)local_160,&local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != paVar3) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append(local_210._M_local_buf);
  GenUnionListConvFuncName_abi_cxx11_(&local_50,this_00,local_318);
  plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x36e2cc);
  plVar13 = plVar8 + 2;
  if ((long *)*plVar8 == plVar13) {
    local_60 = *plVar13;
    lStack_58 = plVar8[3];
    local_70 = &local_60;
  }
  else {
    local_60 = *plVar13;
    local_70 = (long *)*plVar8;
  }
  local_68 = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_70);
  puVar12 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar12) {
    local_268 = *puVar12;
    uStack_260 = (undefined4)plVar8[3];
    uStack_25c = *(undefined4 *)((long)plVar8 + 0x1c);
    local_278 = &local_268;
  }
  else {
    local_268 = *puVar12;
    local_278 = (ulong *)*plVar8;
  }
  local_270 = plVar8[1];
  *plVar8 = (long)puVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  (*(local_168->super_Namer)._vptr_Namer[0xf])(&local_90,local_168,local_318);
  uVar19 = 0xf;
  if (local_278 != &local_268) {
    uVar19 = local_268;
  }
  if (uVar19 < (ulong)(local_88 + local_270)) {
    uVar19 = 0xf;
    if (local_90 != local_80) {
      uVar19 = local_80[0];
    }
    if (uVar19 < (ulong)(local_88 + local_270)) goto LAB_0023a575;
    puVar11 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_278);
  }
  else {
LAB_0023a575:
    puVar11 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_278,(ulong)local_90);
  }
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  psVar14 = puVar11 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_298.field_2._M_allocated_capacity = *psVar14;
    local_298.field_2._8_8_ = puVar11[3];
  }
  else {
    local_298.field_2._M_allocated_capacity = *psVar14;
    local_298._M_dataplus._M_p = (pointer)*puVar11;
  }
  local_298._M_string_length = puVar11[1];
  *puVar11 = psVar14;
  puVar11[1] = 0;
  *(undefined1 *)psVar14 = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_298);
  local_258 = &local_248;
  plVar13 = plVar8 + 2;
  if ((long *)*plVar8 == plVar13) {
    local_248 = *plVar13;
    lStack_240 = plVar8[3];
  }
  else {
    local_248 = *plVar13;
    local_258 = (long *)*plVar8;
  }
  local_250 = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_258,(ulong)local_190);
  local_2b8 = &local_2a8;
  puVar12 = (ulong *)(plVar8 + 2);
  if ((ulong *)*plVar8 == puVar12) {
    local_2a8 = *puVar12;
    lStack_2a0 = plVar8[3];
  }
  else {
    local_2a8 = *puVar12;
    local_2b8 = (ulong *)*plVar8;
  }
  local_2b0 = plVar8[1];
  *plVar8 = (long)puVar12;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  puVar11 = (undefined8 *)std::__cxx11::string::append((char *)&local_2b8);
  plVar8 = puVar11 + 2;
  if ((long *)*puVar11 == plVar8) {
    local_228 = *plVar8;
    uStack_220 = puVar11[3];
    local_238 = &local_228;
  }
  else {
    local_228 = *plVar8;
    local_238 = (long *)*puVar11;
  }
  local_230 = puVar11[1];
  *puVar11 = plVar8;
  puVar11[1] = 0;
  *(undefined1 *)(puVar11 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_238,local_2e8._M_impl._0_8_);
  local_1f0 = &local_1e0;
  plVar13 = plVar8 + 2;
  if ((long *)*plVar8 == plVar13) {
    local_1e0 = *plVar13;
    lStack_1d8 = plVar8[3];
  }
  else {
    local_1e0 = *plVar13;
    local_1f0 = (long *)*plVar8;
  }
  local_1e8 = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1f0);
  local_1d0 = &local_1c0;
  plVar13 = plVar8 + 2;
  if ((long *)*plVar8 == plVar13) {
    local_1c0 = *plVar13;
    lStack_1b8 = plVar8[3];
  }
  else {
    local_1c0 = *plVar13;
    local_1d0 = (long *)*plVar8;
  }
  local_1c8 = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::_M_append((char *)&local_1d0,local_2e8._M_impl._0_8_);
  plVar13 = plVar8 + 2;
  if ((long *)*plVar8 == plVar13) {
    local_1a0 = *plVar13;
    lStack_198 = plVar8[3];
    local_1b0 = &local_1a0;
  }
  else {
    local_1a0 = *plVar13;
    local_1b0 = (long *)*plVar8;
  }
  local_1a8 = plVar8[1];
  *plVar8 = (long)plVar13;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  plVar8 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  psVar14 = (size_type *)(plVar8 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar8 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar14) {
    local_308.field_2._M_allocated_capacity = *psVar14;
    local_308.field_2._8_8_ = plVar8[3];
    local_308._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_308.field_2._M_allocated_capacity = *psVar14;
    local_308._M_dataplus._M_p = (pointer)*plVar8;
  }
  local_308._M_string_length = plVar8[1];
  *plVar8 = (long)psVar14;
  plVar8[1] = 0;
  *(undefined1 *)(plVar8 + 2) = 0;
  std::__cxx11::string::_M_append(local_210._M_local_buf,(ulong)local_308._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != paVar3) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if (local_1b0 != &local_1a0) {
    operator_delete(local_1b0,local_1a0 + 1);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0,local_1c0 + 1);
  }
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0,local_1e0 + 1);
  }
  if (local_238 != &local_228) {
    operator_delete(local_238,local_228 + 1);
  }
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8,local_2a8 + 1);
  }
  if (local_258 != &local_248) {
    operator_delete(local_258,local_248 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if (local_278 != &local_268) {
    operator_delete(local_278,local_268 + 1);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70,local_60 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_1b0 = (long *)0x10;
  local_308._M_dataplus._M_p = (pointer)paVar3;
  local_308._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_308,(ulong)&local_1b0);
  local_308.field_2._M_allocated_capacity = (size_type)local_1b0;
  builtin_strncpy(local_308._M_dataplus._M_p,"accessor(index, ",0x10);
  local_308._M_string_length = (size_type)local_1b0;
  local_308._M_dataplus._M_p[(long)local_1b0] = '\0';
  GenUnionConvFunc::anon_class_40_5_fa253b3e::operator()
            ((anon_class_40_5_fa253b3e *)local_160,&local_308);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != paVar3) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append(local_210._M_local_buf);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,(ulong)(local_338.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((_Base_ptr *)local_2e8._M_impl._0_8_ !=
      &local_2e8._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)local_2e8._M_impl._0_8_,
                    (ulong)((long)&(local_2e8._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  if (local_190 != &local_180) {
    operator_delete(local_190,CONCAT71(uStack_17f,local_180) + 1);
  }
  std::__cxx11::string::_M_append((char *)psVar16,local_210._M_allocated_capacity);
  if ((long *)local_210._M_allocated_capacity != &local_200) {
    operator_delete((void *)local_210._M_allocated_capacity,local_200 + 1);
  }
LAB_0023ab57:
  std::__cxx11::string::append((char *)psVar16);
  return;
}

Assistant:

void GenEnum(EnumDef &enum_def, std::string *code_ptr, import_set &imports,
               bool reverse) {
    if (enum_def.generated) return;
    if (reverse) return;  // FIXME.
    std::string &code = *code_ptr;
    GenDocComment(enum_def.doc_comment, code_ptr);
    code += "export enum ";
    code += GetTypeName(enum_def);
    code += " {\n";
    for (auto it = enum_def.Vals().begin(); it != enum_def.Vals().end(); ++it) {
      auto &ev = **it;
      if (!ev.doc_comment.empty()) {
        if (it != enum_def.Vals().begin()) { code += '\n'; }
        GenDocComment(ev.doc_comment, code_ptr, "  ");
      }

      // Generate mapping between EnumName: EnumValue(int)
      if (reverse) {
        code += "  '" + enum_def.ToString(ev) + "'";
        code += " = ";
        code += "'" + namer_.Variant(ev) + "'";
      } else {
        code += "  " + namer_.Variant(ev);
        code += " = ";
        // Unfortunately, because typescript does not support bigint enums,
        // for 64-bit enums, we instead map the enum names to strings.
        switch (enum_def.underlying_type.base_type) {
          case BASE_TYPE_LONG:
          case BASE_TYPE_ULONG: {
            code += "'" + enum_def.ToString(ev) + "'";
            break;
          }
          default: code += enum_def.ToString(ev);
        }
      }

      code += (it + 1) != enum_def.Vals().end() ? ",\n" : "\n";
    }
    code += "}";

    if (enum_def.is_union) {
      code += GenUnionConvFunc(enum_def.underlying_type, imports);
    }

    code += "\n";
  }